

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
is_value_empty(TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
               *this)

{
  bool bVar1;
  TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *this_local;
  
  bVar1 = has_connections(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::has_value
                      (&this->_attrib);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if ((this->_blocked & 1U) == 0) {
      this_local._7_1_ = (bool)(this->_value_empty & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_value_empty() const {
    if (has_connections()) {
      return false;
    }

    if (_attrib.has_value()) {
      return false;
    }

    if (_blocked) {
      return false;
    }

    return _value_empty;
  }